

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

Fl_Widget * __thiscall Fl_Widget_Type::enter_live_mode(Fl_Widget_Type *this,int param_1)

{
  int iVar1;
  undefined4 extraout_var;
  Fl_Widget *pFVar2;
  
  pFVar2 = this->o;
  iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x29])
                    (this,(ulong)(uint)pFVar2->x_,(ulong)(uint)pFVar2->y_,(ulong)(uint)pFVar2->w_,
                     (ulong)(uint)pFVar2->h_);
  this->live_widget = (Fl_Widget *)CONCAT44(extraout_var,iVar1);
  if ((Fl_Widget *)CONCAT44(extraout_var,iVar1) == (Fl_Widget *)0x0) {
    pFVar2 = (Fl_Widget *)0x0;
  }
  else {
    (*(this->super_Fl_Type)._vptr_Fl_Type[0x15])(this);
    pFVar2 = this->live_widget;
  }
  return pFVar2;
}

Assistant:

Fl_Widget *Fl_Widget_Type::enter_live_mode(int) {
  live_widget = widget(o->x(), o->y(), o->w(), o->h());
  if (live_widget)
    copy_properties();
  return live_widget;
}